

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O3

int * i4row_min(int m,int n,int *a)

{
  int *piVar1;
  int *piVar2;
  ulong uVar3;
  int iVar4;
  long lVar5;
  int *piVar6;
  ulong uVar7;
  
  uVar7 = (ulong)(uint)m;
  uVar3 = 0xffffffffffffffff;
  if (-1 < m) {
    uVar3 = uVar7 * 4;
  }
  piVar1 = (int *)operator_new__(uVar3);
  if (0 < m) {
    piVar2 = a + uVar7;
    uVar3 = 0;
    do {
      iVar4 = a[uVar3];
      piVar1[uVar3] = iVar4;
      lVar5 = (ulong)(uint)n - 1;
      piVar6 = piVar2;
      if (1 < n) {
        do {
          if (*piVar6 < iVar4) {
            iVar4 = *piVar6;
          }
          lVar5 = lVar5 + -1;
          piVar6 = piVar6 + uVar7;
        } while (lVar5 != 0);
        piVar1[uVar3] = iVar4;
      }
      uVar3 = uVar3 + 1;
      piVar2 = piVar2 + 1;
    } while (uVar3 != uVar7);
  }
  return piVar1;
}

Assistant:

int *i4row_min ( int m, int n, int a[] )

//****************************************************************************80
//
//  Purpose:
//
//    I4ROW_MIN returns the minimums of an I4ROW.
//
//  Example:
//
//    A =
//      1  2  3
//      2  6  7
//
//    MIN =
//      1
//      2
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    10 October 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int M, N, the number of rows and columns in the array.
//
//    Input, int A[M*N], the array to be examined.
//
//    Output, int I4ROW_AMIN[M], the minimums of the rows.
//
{
  int i;
  int j;
  int *amin;

  amin = new int[m];

  for ( i = 0; i < m; i++ )
  {
    amin[i] = a[i+0*m];
    for ( j = 1; j < n; j++ )
    {
      if ( a[i+j*m] < amin[i] )
      {
        amin[i] = a[i+j*m];
      }
    }
  }

  return amin;
}